

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH4Factory::BVH4UserGeometry(BVH4Factory *this,Scene *scene,BuildVariant bvariant)

{
  bool bVar1;
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors intersectors;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&Object::type,scene);
  BVH4UserGeometryIntersectors(&intersectors,this,this_00);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"default");
  if (bVar1) {
    if (bvariant != STATIC) {
      if (bvariant != DYNAMIC) {
        builder = (Builder *)0x0;
        goto LAB_0040cec1;
      }
LAB_0040ceaf:
      builder = (*this->BVH4BuilderTwoLevelVirtualSAH)(this_00,scene,false);
      goto LAB_0040cec1;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"sah");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"dynamic");
      if (!bVar1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_180,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
        std::operator+(&local_160,&local_180," for BVH4<Object>");
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_160);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      goto LAB_0040ceaf;
    }
  }
  builder = (*this->BVH4VirtualSceneBuilderSAH)(this_00,scene,0);
LAB_0040cec1:
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&intersectors);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4UserGeometry(Scene* scene, BuildVariant bvariant)
  {
    BVH4* accel = new BVH4(Object::type,scene);
    Accel::Intersectors intersectors = BVH4UserGeometryIntersectors(accel);

    Builder* builder = nullptr;
    if (scene->device->object_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4VirtualSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH4BuilderTwoLevelVirtualSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->object_builder == "sah") builder = BVH4VirtualSceneBuilderSAH(accel,scene,0);
    else if (scene->device->object_builder == "dynamic") builder = BVH4BuilderTwoLevelVirtualSAH(accel,scene,false);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->object_builder+" for BVH4<Object>");

    return new AccelInstance(accel,builder,intersectors);
  }